

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::ModuleDeclarationSyntax::ModuleDeclarationSyntax
          (ModuleDeclarationSyntax *this,SyntaxKind kind,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,ModuleHeaderSyntax *header,
          SyntaxList<slang::syntax::MemberSyntax> *members,Token endmodule,
          NamedBlockClauseSyntax *blockName)

{
  pointer ppMVar1;
  size_type sVar2;
  SyntaxKind SVar3;
  undefined4 uVar4;
  ModuleHeaderSyntax *pMVar5;
  long lVar6;
  ModuleHeaderSyntax *local_30;
  
  MemberSyntax::MemberSyntax(&this->super_MemberSyntax,kind,attributes);
  local_30 = header;
  not_null<slang::syntax::ModuleHeaderSyntax*>::not_null<slang::syntax::ModuleHeaderSyntax*,void>
            ((not_null<slang::syntax::ModuleHeaderSyntax*> *)&this->header,&local_30);
  SVar3 = (members->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar4 = *(undefined4 *)&(members->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->members).super_SyntaxListBase.super_SyntaxNode.parent =
       (members->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->members).super_SyntaxListBase.super_SyntaxNode.kind = SVar3;
  *(undefined4 *)&(this->members).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar4;
  (this->members).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_0046ff68;
  (this->members).super_SyntaxListBase.childCount = (members->super_SyntaxListBase).childCount;
  sVar2 = (members->super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>).size_;
  (this->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.data_ =
       (members->super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>).data_;
  (this->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.size_ = sVar2;
  (this->members).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00473020;
  (this->endmodule).kind = endmodule.kind;
  (this->endmodule).field_0x2 = endmodule._2_1_;
  (this->endmodule).numFlags = (NumericTokenFlags)endmodule.numFlags.raw;
  (this->endmodule).rawLen = endmodule.rawLen;
  (this->endmodule).info = endmodule.info;
  this->blockName = blockName;
  pMVar5 = not_null<slang::syntax::ModuleHeaderSyntax_*>::get(&this->header);
  (pMVar5->super_SyntaxNode).parent = (SyntaxNode *)this;
  (this->members).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  ppMVar1 = (this->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.data_;
  sVar2 = (this->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.size_;
  for (lVar6 = 0; sVar2 << 3 != lVar6; lVar6 = lVar6 + 8) {
    **(undefined8 **)((long)ppMVar1 + lVar6) = this;
  }
  if (this->blockName != (NamedBlockClauseSyntax *)0x0) {
    (this->blockName->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  return;
}

Assistant:

ModuleDeclarationSyntax(SyntaxKind kind, const SyntaxList<AttributeInstanceSyntax>& attributes, ModuleHeaderSyntax& header, const SyntaxList<MemberSyntax>& members, Token endmodule, NamedBlockClauseSyntax* blockName) :
        MemberSyntax(kind, attributes), header(&header), members(members), endmodule(endmodule), blockName(blockName) {
        this->header->parent = this;
        this->members.parent = this;
        for (auto child : this->members)
            child->parent = this;
        if (this->blockName) this->blockName->parent = this;
    }